

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O0

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
annotationCircleOrDisk
          (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this,
          float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d)

{
  Color *in_RCX;
  Vec3 *in_RDX;
  Vec3 *in_RSI;
  int in_R8D;
  byte in_R9B;
  float in_XMM0_Da;
  byte in_stack_00000008;
  bool in_stack_00000352;
  bool in_stack_00000353;
  int in_stack_00000354;
  Color *in_stack_00000358;
  Vec3 *in_stack_00000360;
  Vec3 *in_stack_00000368;
  float in_stack_00000374;
  
  if ((enableAnnotation & 1) != 0) {
    if ((drawPhaseActive & 1) == 0) {
      deferredDrawCircleOrDisk
                (in_XMM0_Da,in_RSI,in_RDX,in_RCX,in_R8D,(bool)(in_R9B & 1),
                 (bool)(in_stack_00000008 & 1));
    }
    else {
      drawCircleOrDisk(in_stack_00000374,in_stack_00000368,in_stack_00000360,in_stack_00000358,
                       in_stack_00000354,in_stack_00000353,in_stack_00000352);
    }
  }
  return;
}

Assistant:

void 
OpenSteer::AnnotationMixin<Super>::annotationCircleOrDisk (const float radius,
                                                           const Vec3& axis,
                                                           const Vec3& center,
                                                           const Color& color,
                                                           const int segments,
                                                           const bool filled,
                                                           const bool in3d) const
{
    if (enableAnnotation)
    {
        if (drawPhaseActive)
        {
            drawCircleOrDisk (radius, axis, center, color,
                              segments, filled, in3d);
        }
        else
        {
            deferredDrawCircleOrDisk (radius, axis, center, color,
                                      segments, filled, in3d);
        }
    }
}